

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O1

void addrinfo_print_list(addrinfo *ailist)

{
  ushort uVar1;
  int __af;
  long lVar2;
  addrinfo *ai;
  char *pcVar3;
  char addrstr [46];
  char acStack_68 [56];
  
  if (ailist != (addrinfo *)0x0) {
    do {
      __af = ailist->ai_family;
      if (__af == 10) {
        lVar2 = 8;
        pcVar3 = "IPv6";
LAB_00177642:
        uVar1 = *(ushort *)ailist->ai_addr->sa_data;
        inet_ntop(__af,ailist->ai_addr->sa_data + lVar2 + -2,acStack_68,0x2e);
        printf("%s %s %d\n",pcVar3,acStack_68,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
      }
      else if (__af == 2) {
        lVar2 = 4;
        pcVar3 = "IPv4";
        goto LAB_00177642;
      }
      ailist = ailist->ai_next;
    } while (ailist != (addrinfo *)0x0);
  }
  return;
}

Assistant:

void addrinfo_print_list(const struct addrinfo *ailist)
{
    const struct addrinfo *ai;
    char addrstr[INET6_ADDRSTRLEN];
    for (ai = ailist; ai != NULL; ai = ai->ai_next)
    {
        char *ipver;
        void *addr;
        unsigned int port = 0;
        if (ai->ai_family == AF_INET6)
        {
            struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)ai->ai_addr;
            addr = &(sa6->sin6_addr);
            ipver = "IPv6";
            port = ntohs(sa6->sin6_port);
        }
        else if (ai->ai_family == AF_INET)
        {
            struct sockaddr_in *sa4 = (struct sockaddr_in *)ai->ai_addr;
            addr = &(sa4->sin_addr);
            ipver = "IPv4";
            port = ntohs(sa4->sin_port);
        }
        else continue;
        INET_NTOP(ai->ai_family, addr, addrstr, INET6_ADDRSTRLEN);
        printf("%s %s %d\n", ipver, addrstr, port);
    }
}